

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint data,Adaptive_Data_Model *M)

{
  uchar *puVar1;
  uint *puVar2;
  uint uVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar3 = this->base;
  uVar6 = this->length >> 0xf;
  uVar5 = M->distribution[data];
  if (M->last_symbol == data) {
    uVar7 = uVar6 * uVar5 + uVar3;
    this->base = uVar7;
    uVar6 = this->length - uVar6 * uVar5;
  }
  else {
    this->length = uVar6;
    uVar7 = uVar6 * uVar5 + uVar3;
    this->base = uVar7;
    uVar6 = (M->distribution[data + 1] - uVar5) * uVar6;
  }
  this->length = uVar6;
  if (uVar7 < uVar3) {
    puVar4 = this->ac_pointer;
    while( true ) {
      puVar1 = puVar4 + -1;
      puVar4 = puVar4 + -1;
      if (*puVar1 != 0xff) break;
      *puVar4 = '\0';
    }
    *puVar4 = *puVar1 + '\x01';
    uVar6 = this->length;
  }
  if (uVar6 < 0x1000000) {
    uVar3 = this->base;
    do {
      puVar4 = this->ac_pointer;
      this->ac_pointer = puVar4 + 1;
      *puVar4 = (uchar)(uVar3 >> 0x18);
      uVar3 = this->base << 8;
      this->base = uVar3;
      uVar5 = this->length << 8;
      this->length = uVar5;
    } while (uVar5 < 0x1000000);
  }
  M->symbol_count[data] = M->symbol_count[data] + 1;
  puVar2 = &M->symbols_until_update;
  *puVar2 = *puVar2 - 1;
  if (*puVar2 != 0) {
    return;
  }
  Adaptive_Data_Model::update(M,true);
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned data,
                                  Adaptive_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
      if (data >= M.data_symbols) 
      {
          AC_Error("invalid data symbol");
      }
    #endif

      unsigned x, init_base = base;
                                                               // compute products
      if (data == M.last_symbol) {
        x = M.distribution[data] * (length >> DM__LengthShift);
        base   += x;                                            // update interval
        length -= x;                                          // no product needed
      }
      else {
        x = M.distribution[data] * (length >>= DM__LengthShift);
        base   += x;                                            // update interval
        length  = M.distribution[data+1] * length - x;
      }

      if (init_base > base) propagate_carry();                 // overflow = carry

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      ++M.symbol_count[data];
      if (--M.symbols_until_update == 0) M.update(true);  // periodic model update
    }